

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O3

void __thiscall
type_safe::detail::
move_assign_union_value<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>
::visitor::operator()
          (void *this,debugger_type *value,tagged_union<int,_double,_debugger_type> *dest)

{
  int iVar1;
  
  if ((dest->cur_type_).
      super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
      .value_ == 3) {
    tagged_union<int,_double,_debugger_type>::check<debugger_type>(dest);
    iVar1 = value->id;
    (dest->storage_).storage_[7] = '\x01';
  }
  else {
    destroy_union<type_safe::tagged_union<int,_double,_debugger_type>_>::destroy(dest);
    iVar1 = value->id;
    (dest->storage_).storage_[4] = '\0';
    (dest->storage_).storage_[5] = '\0';
    (dest->storage_).storage_[6] = '\0';
    (dest->storage_).storage_[7] = '\0';
    (dest->storage_).storage_[8] = '\0';
    (dest->storage_).storage_[9] = '\0';
    (dest->storage_).storage_[4] = '\x01';
    (dest->storage_).storage_[5] = '\x01';
    (dest->cur_type_).
    super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
    .value_ = 3;
  }
  *(int *)(dest->storage_).storage_ = iVar1;
  return;
}

Assistant:

void operator()(T&& value, Union& dest)
            {
                constexpr auto id =
                    typename Union::type_id(union_type<typename std::decay<T>::type>{});
                if (dest.type() == id)
                    do_assign(dest, std::move(value));
                else
                    VariantPolicy::change_value(union_type<typename std::decay<T>::type>{}, dest,
                                                std::move(value));
            }